

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_high24_stage5_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  int iVar24;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  undefined2 local_668;
  undefined2 uStack_666;
  undefined2 uStack_664;
  undefined2 uStack_662;
  undefined2 local_658;
  undefined2 uStack_656;
  undefined2 uStack_654;
  undefined2 uStack_652;
  undefined2 local_648;
  undefined2 uStack_646;
  undefined2 uStack_644;
  undefined2 uStack_642;
  undefined2 local_638;
  undefined2 uStack_636;
  undefined2 uStack_634;
  undefined2 uStack_632;
  undefined2 uStack_620;
  undefined2 uStack_61e;
  undefined2 uStack_61c;
  undefined2 uStack_61a;
  undefined2 uStack_610;
  undefined2 uStack_60e;
  undefined2 uStack_60c;
  undefined2 uStack_60a;
  undefined2 uStack_600;
  undefined2 uStack_5fe;
  undefined2 uStack_5fc;
  undefined2 uStack_5fa;
  undefined2 uStack_5f0;
  undefined2 uStack_5ee;
  undefined2 uStack_5ec;
  undefined2 uStack_5ea;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  
  uVar23 = -*(int *)(in_RSI + 0x40) & 0xffffU | *(int *)(in_RSI + 0xc0) << 0x10;
  uVar21 = CONCAT44(uVar23,uVar23);
  uVar22 = CONCAT44(uVar23,uVar23);
  uVar23 = (uint)*(ushort *)(in_RSI + 0xc0) | *(int *)(in_RSI + 0x40) << 0x10;
  iVar24 = (-*(int *)(in_RSI + 0xc0) & 0xffffU) + *(int *)(in_RSI + 0x40) * -0x10000;
  uVar1 = *(undefined8 *)(in_RDI + 0x90);
  uVar2 = *(undefined8 *)(in_RDI + 0xe0);
  local_638 = (undefined2)uVar1;
  uStack_636 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_634 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_632 = (undefined2)((ulong)uVar1 >> 0x30);
  local_648 = (undefined2)uVar2;
  uStack_646 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_644 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_642 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x98);
  uVar2 = *(undefined8 *)(in_RDI + 0xe8);
  uStack_5f0 = (undefined2)uVar1;
  uStack_5ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_5ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_5ea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_600 = (undefined2)uVar2;
  uStack_5fe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_5fc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_5fa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_648;
  auVar12._0_2_ = local_638;
  auVar12._4_2_ = uStack_636;
  auVar12._6_2_ = uStack_646;
  auVar12._10_2_ = uStack_644;
  auVar12._8_2_ = uStack_634;
  auVar12._12_2_ = uStack_632;
  auVar12._14_2_ = uStack_642;
  auVar11._8_8_ = uVar22;
  auVar11._0_8_ = uVar21;
  auVar25 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_600;
  auVar10._0_2_ = uStack_5f0;
  auVar10._4_2_ = uStack_5ee;
  auVar10._6_2_ = uStack_5fe;
  auVar10._10_2_ = uStack_5fc;
  auVar10._8_2_ = uStack_5ec;
  auVar10._12_2_ = uStack_5ea;
  auVar10._14_2_ = uStack_5fa;
  auVar9._8_8_ = uVar22;
  auVar9._0_8_ = uVar21;
  auVar26 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_648;
  auVar8._0_2_ = local_638;
  auVar8._4_2_ = uStack_636;
  auVar8._6_2_ = uStack_646;
  auVar8._10_2_ = uStack_644;
  auVar8._8_2_ = uStack_634;
  auVar8._12_2_ = uStack_632;
  auVar8._14_2_ = uStack_642;
  auVar7._8_8_ = CONCAT44(uVar23,uVar23);
  auVar7._0_8_ = CONCAT44(uVar23,uVar23);
  auVar27 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_600;
  auVar6._0_2_ = uStack_5f0;
  auVar6._4_2_ = uStack_5ee;
  auVar6._6_2_ = uStack_5fe;
  auVar6._10_2_ = uStack_5fc;
  auVar6._8_2_ = uStack_5ec;
  auVar6._12_2_ = uStack_5ea;
  auVar6._14_2_ = uStack_5fa;
  auVar5._8_8_ = CONCAT44(uVar23,uVar23);
  auVar5._0_8_ = CONCAT44(uVar23,uVar23);
  auVar28 = pmaddwd(auVar6,auVar5);
  local_3f8 = auVar25._0_4_;
  uStack_3f4 = auVar25._4_4_;
  uStack_3f0 = auVar25._8_4_;
  uStack_3ec = auVar25._12_4_;
  local_408 = (int)in_XMM0_Qa;
  uStack_404 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_400 = (int)in_XMM0_Qb;
  uStack_3fc = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_418 = auVar26._0_4_;
  uStack_414 = auVar26._4_4_;
  uStack_410 = auVar26._8_4_;
  uStack_40c = auVar26._12_4_;
  local_438 = auVar27._0_4_;
  uStack_434 = auVar27._4_4_;
  uStack_430 = auVar27._8_4_;
  uStack_42c = auVar27._12_4_;
  local_458 = auVar28._0_4_;
  uStack_454 = auVar28._4_4_;
  uStack_450 = auVar28._8_4_;
  uStack_44c = auVar28._12_4_;
  auVar25 = ZEXT416((uint)(int)in_DL);
  auVar26 = ZEXT416((uint)(int)in_DL);
  auVar27 = ZEXT416((uint)(int)in_DL);
  auVar28 = ZEXT416((uint)(int)in_DL);
  auVar20._4_4_ = uStack_3f4 + uStack_404 >> auVar25;
  auVar20._0_4_ = local_3f8 + local_408 >> auVar25;
  auVar20._12_4_ = uStack_3ec + uStack_3fc >> auVar25;
  auVar20._8_4_ = uStack_3f0 + uStack_400 >> auVar25;
  auVar19._4_4_ = uStack_414 + uStack_404 >> auVar26;
  auVar19._0_4_ = local_418 + local_408 >> auVar26;
  auVar19._12_4_ = uStack_40c + uStack_3fc >> auVar26;
  auVar19._8_4_ = uStack_410 + uStack_400 >> auVar26;
  auVar25 = packssdw(auVar20,auVar19);
  *(undefined1 (*) [16])(in_RDI + 0x90) = auVar25;
  auVar18._4_4_ = uStack_434 + uStack_404 >> auVar27;
  auVar18._0_4_ = local_438 + local_408 >> auVar27;
  auVar18._12_4_ = uStack_42c + uStack_3fc >> auVar27;
  auVar18._8_4_ = uStack_430 + uStack_400 >> auVar27;
  auVar17._4_4_ = uStack_454 + uStack_404 >> auVar28;
  auVar17._0_4_ = local_458 + local_408 >> auVar28;
  auVar17._12_4_ = uStack_44c + uStack_3fc >> auVar28;
  auVar17._8_4_ = uStack_450 + uStack_400 >> auVar28;
  auVar25 = packssdw(auVar18,auVar17);
  *(undefined1 (*) [16])(in_RDI + 0xe0) = auVar25;
  uVar1 = *(undefined8 *)(in_RDI + 0xa0);
  uVar2 = *(undefined8 *)(in_RDI + 0xd0);
  local_658 = (undefined2)uVar1;
  uStack_656 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_654 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_652 = (undefined2)((ulong)uVar1 >> 0x30);
  local_668 = (undefined2)uVar2;
  uStack_666 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_664 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_662 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0xa8);
  uVar2 = *(undefined8 *)(in_RDI + 0xd8);
  uStack_610 = (undefined2)uVar1;
  uStack_60e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_60c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_60a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_620 = (undefined2)uVar2;
  uStack_61e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_61c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_61a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_668;
  auVar4._0_2_ = local_658;
  auVar4._4_2_ = uStack_656;
  auVar4._6_2_ = uStack_666;
  auVar4._10_2_ = uStack_664;
  auVar4._8_2_ = uStack_654;
  auVar4._12_2_ = uStack_652;
  auVar4._14_2_ = uStack_662;
  auVar29._8_8_ = CONCAT44(iVar24,iVar24);
  auVar29._0_8_ = CONCAT44(iVar24,iVar24);
  auVar29 = pmaddwd(auVar4,auVar29);
  auVar3._2_2_ = uStack_620;
  auVar3._0_2_ = uStack_610;
  auVar3._4_2_ = uStack_60e;
  auVar3._6_2_ = uStack_61e;
  auVar3._10_2_ = uStack_61c;
  auVar3._8_2_ = uStack_60c;
  auVar3._12_2_ = uStack_60a;
  auVar3._14_2_ = uStack_61a;
  auVar30._8_8_ = CONCAT44(iVar24,iVar24);
  auVar30._0_8_ = CONCAT44(iVar24,iVar24);
  auVar30 = pmaddwd(auVar3,auVar30);
  auVar28._2_2_ = local_668;
  auVar28._0_2_ = local_658;
  auVar28._4_2_ = uStack_656;
  auVar28._6_2_ = uStack_666;
  auVar28._10_2_ = uStack_664;
  auVar28._8_2_ = uStack_654;
  auVar28._12_2_ = uStack_652;
  auVar28._14_2_ = uStack_662;
  auVar27._8_8_ = uVar22;
  auVar27._0_8_ = uVar21;
  auVar27 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_620;
  auVar26._0_2_ = uStack_610;
  auVar26._4_2_ = uStack_60e;
  auVar26._6_2_ = uStack_61e;
  auVar26._10_2_ = uStack_61c;
  auVar26._8_2_ = uStack_60c;
  auVar26._12_2_ = uStack_60a;
  auVar26._14_2_ = uStack_61a;
  auVar25._8_8_ = uVar22;
  auVar25._0_8_ = uVar21;
  auVar25 = pmaddwd(auVar26,auVar25);
  local_478 = auVar29._0_4_;
  uStack_474 = auVar29._4_4_;
  uStack_470 = auVar29._8_4_;
  uStack_46c = auVar29._12_4_;
  local_498 = auVar30._0_4_;
  uStack_494 = auVar30._4_4_;
  uStack_490 = auVar30._8_4_;
  uStack_48c = auVar30._12_4_;
  local_4b8 = auVar27._0_4_;
  uStack_4b4 = auVar27._4_4_;
  uStack_4b0 = auVar27._8_4_;
  uStack_4ac = auVar27._12_4_;
  local_4d8 = auVar25._0_4_;
  uStack_4d4 = auVar25._4_4_;
  uStack_4d0 = auVar25._8_4_;
  uStack_4cc = auVar25._12_4_;
  auVar25 = ZEXT416((uint)(int)in_DL);
  auVar26 = ZEXT416((uint)(int)in_DL);
  auVar27 = ZEXT416((uint)(int)in_DL);
  auVar28 = ZEXT416((uint)(int)in_DL);
  auVar16._4_4_ = uStack_474 + uStack_404 >> auVar25;
  auVar16._0_4_ = local_478 + local_408 >> auVar25;
  auVar16._12_4_ = uStack_46c + uStack_3fc >> auVar25;
  auVar16._8_4_ = uStack_470 + uStack_400 >> auVar25;
  auVar15._4_4_ = uStack_494 + uStack_404 >> auVar26;
  auVar15._0_4_ = local_498 + local_408 >> auVar26;
  auVar15._12_4_ = uStack_48c + uStack_3fc >> auVar26;
  auVar15._8_4_ = uStack_490 + uStack_400 >> auVar26;
  auVar25 = packssdw(auVar16,auVar15);
  *(undefined1 (*) [16])(in_RDI + 0xa0) = auVar25;
  auVar14._4_4_ = uStack_4b4 + uStack_404 >> auVar27;
  auVar14._0_4_ = local_4b8 + local_408 >> auVar27;
  auVar14._12_4_ = uStack_4ac + uStack_3fc >> auVar27;
  auVar14._8_4_ = uStack_4b0 + uStack_400 >> auVar27;
  auVar13._4_4_ = uStack_4d4 + uStack_404 >> auVar28;
  auVar13._0_4_ = local_4d8 + local_408 >> auVar28;
  auVar13._12_4_ = uStack_4cc + uStack_3fc >> auVar28;
  auVar13._8_4_ = uStack_4d0 + uStack_400 >> auVar28;
  auVar25 = packssdw(auVar14,auVar13);
  *(undefined1 (*) [16])(in_RDI + 0xd0) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x100);
  auVar26 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x100),*(undefined1 (*) [16])(in_RDI + 0x130));
  *(undefined1 (*) [16])(in_RDI + 0x100) = auVar26;
  auVar25 = psubsw(auVar25,*(undefined1 (*) [16])(in_RDI + 0x130));
  *(undefined1 (*) [16])(in_RDI + 0x130) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x110);
  auVar26 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x110),*(undefined1 (*) [16])(in_RDI + 0x120));
  *(undefined1 (*) [16])(in_RDI + 0x110) = auVar26;
  auVar25 = psubsw(auVar25,*(undefined1 (*) [16])(in_RDI + 0x120));
  *(undefined1 (*) [16])(in_RDI + 0x120) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x140);
  auVar26 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x170),*(undefined1 (*) [16])(in_RDI + 0x140));
  *(undefined1 (*) [16])(in_RDI + 0x140) = auVar26;
  auVar25 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x170),auVar25);
  *(undefined1 (*) [16])(in_RDI + 0x170) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x150);
  auVar26 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x160),*(undefined1 (*) [16])(in_RDI + 0x150));
  *(undefined1 (*) [16])(in_RDI + 0x150) = auVar26;
  auVar25 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x160),auVar25);
  *(undefined1 (*) [16])(in_RDI + 0x160) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x180);
  auVar26 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x180),*(undefined1 (*) [16])(in_RDI + 0x1b0));
  *(undefined1 (*) [16])(in_RDI + 0x180) = auVar26;
  auVar25 = psubsw(auVar25,*(undefined1 (*) [16])(in_RDI + 0x1b0));
  *(undefined1 (*) [16])(in_RDI + 0x1b0) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 400);
  auVar26 = paddsw(*(undefined1 (*) [16])(in_RDI + 400),*(undefined1 (*) [16])(in_RDI + 0x1a0));
  *(undefined1 (*) [16])(in_RDI + 400) = auVar26;
  auVar25 = psubsw(auVar25,*(undefined1 (*) [16])(in_RDI + 0x1a0));
  *(undefined1 (*) [16])(in_RDI + 0x1a0) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x1c0);
  auVar26 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1f0),*(undefined1 (*) [16])(in_RDI + 0x1c0));
  *(undefined1 (*) [16])(in_RDI + 0x1c0) = auVar26;
  auVar25 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1f0),auVar25);
  *(undefined1 (*) [16])(in_RDI + 0x1f0) = auVar25;
  auVar25 = *(undefined1 (*) [16])(in_RDI + 0x1d0);
  auVar26 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1e0),*(undefined1 (*) [16])(in_RDI + 0x1d0));
  *(undefined1 (*) [16])(in_RDI + 0x1d0) = auVar26;
  auVar25 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1e0),auVar25);
  *(undefined1 (*) [16])(in_RDI + 0x1e0) = auVar25;
  return;
}

Assistant:

static inline void idct32_high24_stage5_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  btf_16_adds_subs_sse2(x[16], x[19]);
  btf_16_adds_subs_sse2(x[17], x[18]);
  btf_16_subs_adds_sse2(x[23], x[20]);
  btf_16_subs_adds_sse2(x[22], x[21]);
  btf_16_adds_subs_sse2(x[24], x[27]);
  btf_16_adds_subs_sse2(x[25], x[26]);
  btf_16_subs_adds_sse2(x[31], x[28]);
  btf_16_subs_adds_sse2(x[30], x[29]);
}